

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution-results.h
# Opt level: O2

Literals * __thiscall
wasm::LoggingExternalInterface::callExportAsJS
          (Literals *__return_storage_ptr__,LoggingExternalInterface *this,Index index)

{
  __uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_> _Var1;
  IString *pIVar2;
  pointer puVar3;
  ulong uVar4;
  
  uVar4 = (ulong)index;
  puVar3 = (this->wasm->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->wasm->exports).
                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3) <= uVar4) {
    throwJSException(this);
    puVar3 = (this->wasm->exports).
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  _Var1._M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
  super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
       puVar3[uVar4]._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
       _M_t;
  if (*(int *)((long)_Var1._M_t.
                     super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                     super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 0x10) != 0) {
    throwJSException(this);
    _Var1._M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
    super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
         puVar3[uVar4]._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
         _M_t;
  }
  pIVar2 = (IString *)0x0;
  if (*(char *)((long)_Var1._M_t.
                      super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                      super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 0x28) == '\0') {
    pIVar2 = (IString *)
             ((long)_Var1._M_t.
                    super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                    super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 0x18);
  }
  callFunctionAsJS(__return_storage_ptr__,this,(Name)pIVar2->str);
  return __return_storage_ptr__;
}

Assistant:

Literals callExportAsJS(Index index) {
    if (index >= wasm.exports.size()) {
      // No export.
      throwJSException();
    }
    auto& exp = wasm.exports[index];
    if (exp->kind != ExternalKind::Function) {
      // No callable export.
      throwJSException();
    }
    return callFunctionAsJS(*exp->getInternalName());
  }